

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.hpp
# Opt level: O0

void __thiscall Array<Address>::Array(Array<Address> *this,Array<Address> *other)

{
  Address *pAVar1;
  usize size;
  Address *end;
  Address *src;
  Address *dest;
  Array<Address> *other_local;
  Array<Address> *this_local;
  
  Iterator::Iterator(&this->_begin);
  Iterator::Iterator(&this->_end);
  this->_capacity = 0;
  size = capacity(other);
  reserve(this,size);
  src = (this->_begin).item;
  pAVar1 = (other->_end).item;
  for (end = (other->_begin).item; end != pAVar1; end = end + 1) {
    *src = *end;
    src = src + 1;
  }
  (this->_end).item = src;
  return;
}

Assistant:

Array(const Array& other) : _capacity(0)
  {
    reserve(other.capacity());
    T* dest = _begin.item;
    for(T* src = other._begin.item, * end = other._end.item; src != end; ++src, ++dest)
    {
#ifdef VERIFY
      VERIFY(new(dest)T(*src) == dest);
#else
      new(dest)T(*src);
#endif
    }
    _end.item = dest;
  }